

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder_context.h
# Opt level: O3

void __thiscall
mocker::ir::BuilderContext::
emplaceInst<mocker::ir::Store,std::shared_ptr<mocker::ir::Addr>&,std::shared_ptr<mocker::ir::Reg>&>
          (BuilderContext *this,shared_ptr<mocker::ir::Addr> *args,
          shared_ptr<mocker::ir::Reg> *args_1)

{
  shared_ptr<mocker::ir::Store> inst;
  undefined1 local_39;
  Store *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  shared_ptr<mocker::ir::IRInst> local_28;
  
  local_38 = (Store *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<mocker::ir::Store,std::allocator<mocker::ir::Store>,std::shared_ptr<mocker::ir::Addr>&,std::shared_ptr<mocker::ir::Reg>&>
            (&_Stack_30,&local_38,(allocator<mocker::ir::Store> *)&local_39,args,args_1);
  local_28.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_38->super_IRInst;
  local_28.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_30._M_pi;
  local_38 = (Store *)0x0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  appendInst(this,&local_28);
  if (local_28.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
  }
  return;
}

Assistant:

void emplaceInst(Args &&... args) {
    auto inst = std::make_shared<InstType>(std::forward<Args>(args)...);
    appendInst(std::move(inst));
  }